

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::AtomicCounterSimple::Run(AtomicCounterSimple *this)

{
  CallLogWrapper *pCVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  GLuint program;
  mapped_type *pmVar6;
  iterator iVar7;
  long lVar8;
  bool *compile_error;
  long lVar9;
  GLint res;
  allocator<char> local_20c1;
  long error;
  GLenum prop;
  GLsizei length;
  CallLogWrapper *local_20b0;
  GLenum prop2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  GLenum props2 [3];
  key_type local_2060;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp2;
  GLint max_buffer_bindings;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  GLint expected [4];
  GLenum props [4];
  string local_1fb8;
  GLint expected3 [3];
  GLint expected2 [3];
  GLint param [1000];
  GLint param2 [1000];
  
  max_buffer_bindings = 0;
  pCVar1 = &(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x8264,&max_buffer_bindings);
  if (max_buffer_bindings < 6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fb8,
               "Test requires at least 6 atomic counter buffer binding points.",
               (allocator<char> *)param);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_1fb8);
    std::__cxx11::string::~string((string *)&local_1fb8);
    return 0x10;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,
             "layout(local_size_x = 1, local_size_y = 1) in;  \nlayout(std430) buffer Output {                  \n   mediump vec4 data;                           \n} g_out;                                        \nlayout (binding = 1, offset = 0) uniform highp atomic_uint a;    \nlayout (binding = 2, offset = 0) uniform highp atomic_uint b;    \nlayout (binding = 2, offset = 4) uniform highp atomic_uint c;    \nlayout (binding = 5, offset = 0) uniform highp atomic_uint d[3]; \nlayout (binding = 5, offset = 12) uniform highp atomic_uint e;   \nvoid main() {                                                         \n   uint x = atomicCounterIncrement(d[0]) + atomicCounterIncrement(a); \n   uint y = atomicCounterIncrement(d[1]) + atomicCounterIncrement(b); \n   uint z = atomicCounterIncrement(d[2]) + atomicCounterIncrement(c); \n   uint w = atomicCounterIncrement(e);                                \n   g_out.data = vec4(float(x), float(y), float(z), float(w));         \n}"
             ,(allocator<char> *)param2);
  program = ComputeShaderTest::CreateComputeProgram(&this->super_ComputeShaderTest,(string *)param);
  std::__cxx11::string::~string((string *)param);
  glu::CallLogWrapper::glLinkProgram(pCVar1,program);
  bVar5 = ComputeShaderTest::CheckProgram(&this->super_ComputeShaderTest,program,compile_error);
  if (!bVar5) {
    glu::CallLogWrapper::glDeleteProgram(pCVar1,program);
    return -1;
  }
  glu::CallLogWrapper::glUseProgram(pCVar1,program);
  error = 0;
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xd])(this,(ulong)program,0x92c0,0x92f5,3,&error);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xd])(this,(ulong)program,0x92c0,0x92f7,2,&error);
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xf])(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xf])(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xf])(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xf])(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0xf])(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)&exp);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"a",(allocator<char> *)&exp2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)&exp);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"b",(allocator<char> *)&exp2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)&exp);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"c",(allocator<char> *)&exp2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)&exp);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar6;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param2,"d[0]",(allocator<char> *)&exp2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)&exp);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"e",(allocator<char> *)&exp2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,"d[0]",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,"d[1]",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,"d[2]",(allocator<char> *)param2);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  prop = 0x9301;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  props[0] = 0x9302;
  props[1] = 0x9303;
  props[2] = 0x9304;
  props[3] = 0x9305;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  expected[0] = 1;
  expected[1] = 4;
  expected[2] = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  local_20b0 = pCVar1;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  expected[3] = *pmVar6;
  std::__cxx11::string::~string((string *)param);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,4,props,4,expected,&error);
  props2[0] = 0x9302;
  props2[1] = 0x9303;
  props2[2] = 0x9304;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)param2);
  pCVar1 = local_20b0;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  expected2[0] = 2;
  expected2[1] = 8;
  expected2[2] = 2;
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected2,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)param2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected2,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)param2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  expected3[0] = 5;
  expected3[1] = 0x10;
  expected3[2] = 2;
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected3,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)param2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected3,&error);
  prop2 = 0x9305;
  p_Var2 = &exp._M_t._M_impl.super__Rb_tree_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"b",(allocator<char> *)&exp2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar6);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"c",(allocator<char> *)&exp2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar6);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"b",(allocator<char> *)&exp2);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param2);
  glu::CallLogWrapper::glGetProgramResourceiv(pCVar1,program,0x92c0,res,1,&prop2,1000,&length,param)
  ;
  lVar8 = (long)length;
  lVar4 = 0;
  do {
    lVar9 = lVar4;
    if (lVar8 <= lVar9) {
      p_Var2 = &exp2._M_t._M_impl.super__Rb_tree_header;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      exp2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2060,"d",&local_20c1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&indicesU,&local_2060);
      pCVar1 = local_20b0;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&exp2,pmVar6);
      std::__cxx11::string::~string((string *)&local_2060);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2060,"e",&local_20c1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&indicesU,&local_2060);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&exp2,pmVar6);
      std::__cxx11::string::~string((string *)&local_2060);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2060,"d",&local_20c1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&indicesU,&local_2060);
      glu::CallLogWrapper::glGetProgramResourceiv
                (pCVar1,program,0x92e1,*pmVar6,1,&prop,1000,&length,&res);
      std::__cxx11::string::~string((string *)&local_2060);
      glu::CallLogWrapper::glGetProgramResourceiv
                (pCVar1,program,0x92c0,res,1,&prop2,1000,&length,param2);
      lVar8 = (long)length;
      lVar4 = 0;
      goto LAB_00c33fb3;
    }
    param2[0] = param[lVar9];
    iVar7 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&exp._M_t,(key_type *)param2);
  } while (((_Rb_tree_header *)iVar7._M_node != p_Var2) &&
          (lVar8 = 2, lVar4 = lVar9 + 1, length == 2));
  anon_unknown_0::Output("Length: %d\n");
  anon_unknown_0::Output
            ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n",
             (ulong)(uint)param[lVar9]);
  glu::CallLogWrapper::glDeleteProgram(local_20b0,program);
  lVar8 = -1;
  goto LAB_00c34036;
  while( true ) {
    local_2060._M_dataplus._M_p._0_4_ = param2[lVar9];
    iVar7 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&exp2._M_t,(key_type *)&local_2060);
    if (((_Rb_tree_header *)iVar7._M_node == p_Var2) || (lVar8 = 2, lVar4 = lVar9 + 1, length != 2))
    break;
LAB_00c33fb3:
    lVar9 = lVar4;
    if (lVar8 <= lVar9) {
      glu::CallLogWrapper::glDeleteProgram(local_20b0,program);
      lVar8 = error;
      goto LAB_00c34029;
    }
  }
  anon_unknown_0::Output("Length: %d\n");
  anon_unknown_0::Output
            ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n",
             (ulong)(uint)param[lVar9 + 1000]);
  glu::CallLogWrapper::glDeleteProgram(local_20b0,program);
  lVar8 = -1;
LAB_00c34029:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp2._M_t);
LAB_00c34036:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesU._M_t);
  return lVar8;
}

Assistant:

virtual long Run()
	{

		GLint max_buffer_bindings = 0;
		glGetIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, &max_buffer_bindings);
		if (max_buffer_bindings < 6)
		{
			OutputNotSupported("Test requires at least 6 atomic counter buffer binding points.");
			return NOT_SUPPORTED;
		}

		const char* const glsl_cs = "layout(local_size_x = 1, local_size_y = 1) in;  \n"
									"layout(std430) buffer Output {                  \n"
									"   mediump vec4 data;                           \n"
									"} g_out;                                        \n"
									""
									"layout (binding = 1, offset = 0) uniform highp atomic_uint a;    \n"
									"layout (binding = 2, offset = 0) uniform highp atomic_uint b;    \n"
									"layout (binding = 2, offset = 4) uniform highp atomic_uint c;    \n"
									"layout (binding = 5, offset = 0) uniform highp atomic_uint d[3]; \n"
									"layout (binding = 5, offset = 12) uniform highp atomic_uint e;   \n"
									""
									"void main() {                                                         \n"
									"   uint x = atomicCounterIncrement(d[0]) + atomicCounterIncrement(a); \n"
									"   uint y = atomicCounterIncrement(d[1]) + atomicCounterIncrement(b); \n"
									"   uint z = atomicCounterIncrement(d[2]) + atomicCounterIncrement(c); \n"
									"   uint w = atomicCounterIncrement(e);                                \n"
									"   g_out.data = vec4(float(x), float(y), float(z), float(w));         \n"
									"}";

		GLuint program = CreateComputeProgram(glsl_cs);
		glLinkProgram(program);
		if (!CheckProgram(program))
		{
			glDeleteProgram(program);
			return ERROR;
		}
		glUseProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, 3, error);
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 2, error);

		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "e", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["c"], "c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["d"], "d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["e"], "e", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[1]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[2]", -1, error);

		GLenum		  prop	= GL_ATOMIC_COUNTER_BUFFER_INDEX;
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  res;
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);

		GLenum props[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES, GL_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);
		GLint expected[] = { 1, 4, 1, static_cast<GLint>(indicesU["a"]) };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 4, props, 4, expected, error);

		GLenum props2[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		GLint expected2[] = { 2, 8, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["c"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);

		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		GLint expected3[] = { 5, 16, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["e"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);

		GLenum			 prop2 = GL_ACTIVE_VARIABLES;
		GLint			 param[bufSize];
		std::set<GLuint> exp;
		exp.insert(indicesU["b"]);
		exp.insert(indicesU["c"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}
		std::set<GLuint> exp2;
		GLint			 param2[bufSize];
		exp2.insert(indicesU["d"]);
		exp2.insert(indicesU["e"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param2);
		for (int i = 0; i < length; ++i)
		{
			if (exp2.find(param2[i]) == exp2.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param2[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}

		glDeleteProgram(program);
		return error;
	}